

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

void __thiscall
CFGTest_ReachingDefinitionsIf_Test::TestBody(CFGTest_ReachingDefinitionsIf_Test *this)

{
  bool *pbVar1;
  __node_base_ptr *this_00;
  char *pcVar2;
  Function *func;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar3;
  Name NVar4;
  undefined1 local_680 [8];
  Module wasm;
  ReachingDefinitionsTransferFunction transferFunction;
  Locations locations;
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  analyzer;
  GetSetsMap getSetsMap;
  LocalGet *getA1;
  CFG cfg;
  FindAll<wasm::LocalGet> foundGets;
  LocalSet *setB;
  LocalSet *setA2;
  GetSetsMap expectedResult;
  FindAll<wasm::LocalSet> foundSets;
  LocalGet *getB;
  LocalGet *getA2;
  LocalSet *setA1;
  __node_base local_40;
  Message local_38;
  AssertHelper local_30;
  
  ::wasm::Module::Module((Module *)local_680);
  pbVar1 = &transferFunction.
            super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
            .collectingResults;
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,
             "\n    (module\n      (func $bar\n        (local $a i32)\n        (local $b i32)\n        (local.set $a\n          (i32.const 1)\n        )\n        (if\n          (i32.eq\n            (local.get $a)\n            (i32.const 2)\n          )\n          (then\n            (local.set $b\n              (i32.const 3)\n            )\n          )\n          (else\n            (local.set $a\n              (i32.const 4)\n            )\n          )\n        )\n        (drop\n          (local.get $b)\n        )\n        (drop\n          (local.get $a)\n        )\n      )\n    )\n  "
             ,"");
  PrintTest::parseWast
            (&this->super_CFGTest,(Module *)local_680,(string *)&wasm.tagsMap._M_h._M_single_bucket)
  ;
  if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)pbVar1) {
    operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                    transferFunction.
                    super_VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                    ._8_8_ + 1);
  }
  pcVar2 = (char *)::wasm::IString::interned(3,"bar",0);
  NVar4.super_IString.str._M_str = pcVar2;
  NVar4.super_IString.str._M_len = (size_t)local_680;
  func = (Function *)::wasm::Module::getFunction(NVar4);
  ::wasm::analysis::CFG::fromFunction((Function *)&getA1);
  analyzer.states.
  super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&getSetsMap._M_h._M_rehash_policy._M_next_resize;
  getSetsMap._M_h._M_buckets = (__buckets_ptr)0x1;
  getSetsMap._M_h._M_bucket_count = 0;
  getSetsMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  getSetsMap._M_h._M_element_count._0_4_ = 0x3f800000;
  getSetsMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  getSetsMap._M_h._M_rehash_policy._4_4_ = 0;
  getSetsMap._M_h._M_rehash_policy._M_next_resize = 0;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&locations;
  locations._M_t._M_impl._0_4_ = 0;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  this_00 = &wasm.tagsMap._M_h._M_single_bucket;
  locations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       locations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  ::wasm::analysis::ReachingDefinitionsTransferFunction::ReachingDefinitionsTransferFunction
            ((ReachingDefinitionsTransferFunction *)this_00,func,
             (GetSetsMap *)
             &analyzer.states.
              super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Locations *)&transferFunction.lattice.memberIndices._M_h._M_single_bucket);
  locations._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&transferFunction.fakeSetPtrs._M_h._M_single_bucket;
  analyzer.lattice = (FinitePowersetLattice<wasm::LocalSet_*> *)this_00;
  analyzer.txfn = (ReachingDefinitionsTransferFunction *)&getA1;
  ::wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>::getBottom
            ((Element *)&setA2,
             (FinitePowersetLattice<wasm::LocalSet_*> *)
             locations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
  ::vector((vector<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
            *)&analyzer.cfg,(cfg._0_8_ - (long)getA1 >> 4) * -0x3333333333333333,(Element *)&setA2,
           (allocator_type *)&expectedResult._M_h._M_single_bucket);
  if (setA2 != (LocalSet *)0x0) {
    operator_delete(setA2,CONCAT44(expectedResult._M_h._M_element_count._4_4_,
                                   (undefined4)expectedResult._M_h._M_element_count) - (long)setA2);
  }
  ::wasm::analysis::ReachingDefinitionsTransferFunction::evaluateFunctionEntry
            ((ReachingDefinitionsTransferFunction *)analyzer.lattice,func,(Element *)analyzer.cfg);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::evaluateAndCollectResults
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&locations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)&expectedResult._M_h._M_single_bucket,func->body);
  ::wasm::FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)&cfg.field_0x10,func->body);
  getSetsMap._M_h._M_single_bucket = *(__node_base_ptr *)cfg._16_8_;
  foundSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)(cfg._16_8_ + 8);
  getB = *(LocalGet **)(cfg._16_8_ + 0x10);
  getA2 = (LocalGet *)(expectedResult._M_h._M_single_bucket)->_M_nxt;
  foundGets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)expectedResult._M_h._M_single_bucket[1]._M_nxt;
  setB = (LocalSet *)expectedResult._M_h._M_single_bucket[2]._M_nxt;
  setA2 = (LocalSet *)&expectedResult._M_h._M_rehash_policy._M_next_resize;
  expectedResult._M_h._M_buckets = (__buckets_ptr)0x1;
  expectedResult._M_h._M_bucket_count = 0;
  expectedResult._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  expectedResult._M_h._M_element_count._0_4_ = 0x3f800000;
  expectedResult._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  expectedResult._M_h._M_rehash_policy._4_4_ = 0;
  expectedResult._M_h._M_rehash_policy._M_next_resize = 0;
  pSVar3 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&setA2,(key_type *)&getSetsMap._M_h._M_single_bucket)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar3,(LocalSet **)&getA2);
  pSVar3 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&setA2,
                         (key_type *)
                         &foundSets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  setA1 = (LocalSet *)0x0;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar3,&setA1);
  pSVar3 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&setA2,
                         (key_type *)
                         &foundSets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar3,(LocalSet **)
                  &foundGets.list.
                   super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  pSVar3 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&setA2,&getB)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar3,(LocalSet **)&getA2);
  pSVar3 = &std::__detail::
            _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&setA2,&getB)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar3,&setB);
  testing::internal::
  CmpHelperEQ<std::unordered_map<wasm::LocalGet*,wasm::SmallSet<wasm::LocalSet*,2ul>,std::hash<wasm::LocalGet*>,std::equal_to<wasm::LocalGet*>,std::allocator<std::pair<wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>>>,std::unordered_map<wasm::LocalGet*,wasm::SmallSet<wasm::LocalSet*,2ul>,std::hash<wasm::LocalGet*>,std::equal_to<wasm::LocalGet*>,std::allocator<std::pair<wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>>>>
            ((internal *)&setA1,"expectedResult","getSetsMap",
             (unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
              *)&setA2,
             (unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
              *)&analyzer.states.
                 super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((char)setA1 == '\0') {
    testing::Message::Message(&local_38);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40._M_nxt ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(local_40._M_nxt)->_M_nxt)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cfg.cpp"
               ,400,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_38.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40._M_nxt !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_40._M_nxt);
  }
  std::
  _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&setA2);
  if (cfg._16_8_ != 0) {
    operator_delete((void *)cfg._16_8_,
                    (long)foundGets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - cfg._16_8_);
  }
  if (expectedResult._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(expectedResult._M_h._M_single_bucket,
                    (long)foundSets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)expectedResult._M_h._M_single_bucket);
  }
  std::
  vector<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
  ::~vector((vector<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
             *)&analyzer.cfg);
  std::
  _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&transferFunction.lattice.members.
                    super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (transferFunction.lattice.intLattice.setSize != 0) {
    operator_delete((void *)transferFunction.lattice.intLattice.setSize,
                    (long)transferFunction.lattice.members.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    transferFunction.lattice.intLattice.setSize);
  }
  std::
  _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&transferFunction.fakeInitialValueSets.
                    super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (transferFunction.getSetsMap != (GetSetsMap *)0x0) {
    operator_delete(transferFunction.getSetsMap,
                    (long)transferFunction.fakeInitialValueSets.
                          super__Vector_base<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)transferFunction.getSetsMap);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_wasm::SmallVector<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&transferFunction.numLocals);
  std::
  _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_**>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_**>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
               *)&transferFunction.lattice.memberIndices._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&analyzer.states.
                    super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>::~vector
            ((vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_> *)
             &getA1);
  ::wasm::Module::~Module((Module *)local_680);
  return;
}

Assistant:

TEST_F(CFGTest, ReachingDefinitionsIf) {
  auto moduleText = R"wasm(
    (module
      (func $bar
        (local $a i32)
        (local $b i32)
        (local.set $a
          (i32.const 1)
        )
        (if
          (i32.eq
            (local.get $a)
            (i32.const 2)
          )
          (then
            (local.set $b
              (i32.const 3)
            )
          )
          (else
            (local.set $a
              (i32.const 4)
            )
          )
        )
        (drop
          (local.get $b)
        )
        (drop
          (local.get $a)
        )
      )
    )
  )wasm";

  Module wasm;
  parseWast(wasm, moduleText);

  Function* func = wasm.getFunction("bar");
  CFG cfg = CFG::fromFunction(func);

  LocalGraph::GetSetsMap getSetsMap;
  LocalGraph::Locations locations;
  ReachingDefinitionsTransferFunction transferFunction(
    func, getSetsMap, locations);

  MonotoneCFGAnalyzer<FinitePowersetLattice<LocalSet*>,
                      ReachingDefinitionsTransferFunction>
    analyzer(transferFunction.lattice, transferFunction, cfg);
  analyzer.evaluateFunctionEntry(func);
  analyzer.evaluateAndCollectResults();

  FindAll<LocalSet> foundSets(func->body);
  FindAll<LocalGet> foundGets(func->body);

  LocalGet* getA1 = foundGets.list[0];
  LocalGet* getB = foundGets.list[1];
  LocalGet* getA2 = foundGets.list[2];
  LocalSet* setA1 = foundSets.list[0];
  LocalSet* setB = foundSets.list[1];
  LocalSet* setA2 = foundSets.list[2];

  LocalGraph::GetSetsMap expectedResult;
  expectedResult[getA1].insert(setA1);
  expectedResult[getB].insert(nullptr);
  expectedResult[getB].insert(setB);
  expectedResult[getA2].insert(setA1);
  expectedResult[getA2].insert(setA2);

  EXPECT_EQ(expectedResult, getSetsMap);
}